

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2117e76::DropoutTest_NumBeforeLargerThanNumAfter_Test::TestBody
          (DropoutTest_NumBeforeLargerThanNumAfter_Test *this)

{
  int in_ECX;
  tran_low_t *in_R8;
  initializer_list<int> __l;
  tran_low_t qcoeff_scan [32];
  allocator_type local_131;
  vector<int,_std::allocator<int>_> local_130;
  int local_118 [32];
  tran_low_t local_98 [34];
  
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[0x1c] = 0;
  local_98[0x1d] = 0;
  local_98[0x1e] = 0;
  local_98[0x1f] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  local_98[0x1a] = 0;
  local_98[0x1b] = 0;
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[4] = 1;
  local_98[5] = 0;
  local_98[8] = -2;
  local_98[9] = 0;
  Dropout('\x06','\x02',(int)local_98,in_ECX,in_R8);
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  __l._M_len = 0x20;
  __l._M_array = local_118;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l,&local_131);
  ExpectArrayEq(local_98,&local_130);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(DropoutTest, NumBeforeLargerThanNumAfter) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 2;
  // The second coeff (-2) doesn't seem to meet the dropout_num_before
  // criteria. But since the first coeff (1) will be dropped, it will meet
  // the criteria and should be dropped too.
  tran_low_t qcoeff_scan[] = { 0,  0, 0, 0, 1, 0, 0, 0,  // should be removed
                               -2, 0, 0, 0, 0, 0, 0, 0,  // should be removed
                               0,  0, 0, 0, 0, 0, 0, 0,  //
                               0,  0, 0, 0, 0, 0, 0, 0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0 });
}